

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

void __thiscall
kj::Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::eraseImpl
          (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this,
          size_t pos)

{
  StringPtr *pSVar1;
  HashBucket *pHVar2;
  StringPtr *pSVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  RemoveConst<kj::StringPtr> *pRVar7;
  StringPtr *in_R8;
  uint uVar8;
  size_t sVar9;
  ArrayPtr<kj::StringPtr> table;
  ArrayPtr<const_unsigned_char> s;
  
  pSVar1 = (this->rows).builder.ptr;
  table.size_ = (size_t)pSVar1[pos].content.ptr;
  table.ptr = (StringPtr *)pos;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher>::erase<kj::StringPtr,kj::StringPtr>
            (&this->indexes,table,pSVar1[pos].content.size_,in_R8);
  pSVar1 = (this->rows).builder.ptr;
  pRVar7 = (this->rows).builder.pos;
  sVar9 = ((long)pRVar7 - (long)pSVar1 >> 4) - 1;
  if (sVar9 != pos) {
    s.size_ = pSVar1[sVar9].content.size_ - 1;
    s.ptr = (uchar *)pSVar1[sVar9].content.ptr;
    uVar4 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s);
    uVar4 = _::chooseBucket(uVar4,(uint)(this->indexes).buckets.size_);
    pHVar2 = (this->indexes).buckets.ptr;
    uVar8 = (int)sVar9 + 2;
    uVar5 = (ulong)uVar4;
    uVar4 = pHVar2[uVar5].value;
    if (uVar8 != uVar4) {
      do {
        if (uVar4 == 0) {
          _::logHashTableInconsistency();
          goto LAB_00140af5;
        }
        uVar6 = uVar5 + 1;
        uVar5 = uVar6 & 0xffffffff;
        if (uVar6 == (this->indexes).buckets.size_) {
          uVar5 = 0;
        }
        uVar4 = pHVar2[uVar5].value;
      } while (uVar8 != uVar4);
    }
    pHVar2[uVar5].value = (int)pos + 2;
LAB_00140af5:
    pSVar3 = (this->rows).builder.ptr;
    pSVar1 = pSVar3 + sVar9;
    sVar9 = (pSVar1->content).size_;
    pSVar3 = pSVar3 + pos;
    (pSVar3->content).ptr = (pSVar1->content).ptr;
    (pSVar3->content).size_ = sVar9;
    pRVar7 = (this->rows).builder.pos;
  }
  (this->rows).builder.pos = pRVar7 + -1;
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}